

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O2

int nn_bipc_create(nn_ep *ep)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  nn_bipc *self;
  nn_ctx *ctx;
  char *pcVar4;
  size_t sVar5;
  uint *puVar6;
  FILE *pFVar7;
  undefined8 uVar8;
  nn_usock *self_00;
  sockaddr local_a8 [6];
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  self = (nn_bipc *)nn_alloc_(0x2e0);
  if (self == (nn_bipc *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
            ,0x62);
  }
  else {
    self->ep = ep;
    nn_ep_tran_setup(ep,&nn_bipc_ep_ops,self);
    ctx = nn_ep_getctx(ep);
    nn_fsm_init_root((nn_fsm *)self,nn_bipc_handler,nn_bipc_shutdown,ctx);
    self->state = 1;
    self->aipc = (nn_aipc *)0x0;
    nn_list_init(&self->aipcs);
    nn_fsm_start((nn_fsm *)self);
    self_00 = &self->usock;
    nn_usock_init(self_00,1,(nn_fsm *)self);
    pcVar4 = nn_ep_getaddr(self->ep);
    local_40 = 0;
    uStack_38 = 0;
    local_30 = 0;
    sVar5 = strlen(pcVar4);
    if (sVar5 < 0x6c) {
      local_a8[0].sa_family = 1;
      strncpy(local_a8[0].sa_data,pcVar4,0x6c);
      iVar2 = socket(1,1,0);
      if (iVar2 < 0) {
LAB_0011f267:
        iVar2 = nn_usock_start(self_00,1,1,0);
        if (-1 < iVar2) {
          iVar2 = nn_usock_bind(self_00,local_a8,0x6e);
          if ((iVar2 < 0) || (iVar2 = nn_usock_listen(self_00,10), iVar2 < 0)) {
            nn_usock_stop(self_00);
          }
          else {
            nn_bipc_start_accepting(self);
            iVar2 = 0;
          }
        }
        return iVar2;
      }
      iVar3 = fcntl(iVar2,4,0x800);
      if ((iVar3 == -1) && (puVar6 = (uint *)__errno_location(), *puVar6 != 0x16)) {
        nn_backtrace_print();
        pFVar7 = _stderr;
        pcVar4 = nn_err_strerror(*puVar6);
        uVar1 = *puVar6;
        uVar8 = 0x130;
      }
      else {
        iVar3 = connect(iVar2,(sockaddr *)local_a8,0x6e);
        if ((((iVar3 != -1) || (puVar6 = (uint *)__errno_location(), *puVar6 != 0x6f)) ||
            (iVar3 = unlink(pcVar4), iVar3 == 0)) || (*puVar6 == 2)) {
          iVar2 = close(iVar2);
          if (iVar2 != 0) {
            nn_backtrace_print();
            pFVar7 = _stderr;
            puVar6 = (uint *)__errno_location();
            pcVar4 = nn_err_strerror(*puVar6);
            fprintf(pFVar7,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
                    ,0x138);
            goto LAB_0011f3eb;
          }
          goto LAB_0011f267;
        }
        nn_backtrace_print();
        pFVar7 = _stderr;
        pcVar4 = nn_err_strerror(*puVar6);
        uVar1 = *puVar6;
        uVar8 = 0x135;
      }
      fprintf(pFVar7,"%s [%d] (%s:%d)\n",pcVar4,(ulong)uVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
              ,uVar8);
    }
    else {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","strlen (addr) < sizeof (un->sun_path)",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
              ,0x124);
    }
  }
LAB_0011f3eb:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_bipc_create (struct nn_ep *ep)
{
    struct nn_bipc *self;
    int rc;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_bipc), "bipc");
    alloc_assert (self);


    /*  Initialise the structure. */
    self->ep = ep;
    nn_ep_tran_setup (ep, &nn_bipc_ep_ops, self);
    nn_fsm_init_root (&self->fsm, nn_bipc_handler, nn_bipc_shutdown,
        nn_ep_getctx (ep));
    self->state = NN_BIPC_STATE_IDLE;
    self->aipc = NULL;
    nn_list_init (&self->aipcs);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    nn_usock_init (&self->usock, NN_BIPC_SRC_USOCK, &self->fsm);

    rc = nn_bipc_listen (self);
    if (rc != 0) {
        return rc;
    }

    return 0;
}